

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BatchedMatMulLayerParams::SerializeWithCachedSizes
          (BatchedMatMulLayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  uint64 uVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  BatchedMatMulLayerParams *this_local;
  
  bVar1 = transposea(this);
  if (bVar1) {
    bVar1 = transposea(this);
    google::protobuf::internal::WireFormatLite::WriteBool(1,bVar1,output);
  }
  bVar1 = transposeb(this);
  if (bVar1) {
    bVar1 = transposeb(this);
    google::protobuf::internal::WireFormatLite::WriteBool(2,bVar1,output);
  }
  uVar2 = weightmatrixfirstdimension(this);
  if (uVar2 != 0) {
    uVar2 = weightmatrixfirstdimension(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(5,uVar2,output);
  }
  uVar2 = weightmatrixseconddimension(this);
  if (uVar2 != 0) {
    uVar2 = weightmatrixseconddimension(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(6,uVar2,output);
  }
  bVar1 = hasbias(this);
  if (bVar1) {
    bVar1 = hasbias(this);
    google::protobuf::internal::WireFormatLite::WriteBool(7,bVar1,output);
  }
  bVar1 = has_weights(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (8,&this->weights_->super_MessageLite,output);
  }
  bVar1 = has_bias(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (9,&this->bias_->super_MessageLite,output);
  }
  bVar1 = int8dynamicquantize(this);
  if (bVar1) {
    bVar1 = int8dynamicquantize(this);
    google::protobuf::internal::WireFormatLite::WriteBool(10,bVar1,output);
  }
  return;
}

Assistant:

void BatchedMatMulLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.BatchedMatMulLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // bool transposeA = 1;
  if (this->transposea() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(1, this->transposea(), output);
  }

  // bool transposeB = 2;
  if (this->transposeb() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(2, this->transposeb(), output);
  }

  // uint64 weightMatrixFirstDimension = 5;
  if (this->weightmatrixfirstdimension() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(5, this->weightmatrixfirstdimension(), output);
  }

  // uint64 weightMatrixSecondDimension = 6;
  if (this->weightmatrixseconddimension() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(6, this->weightmatrixseconddimension(), output);
  }

  // bool hasBias = 7;
  if (this->hasbias() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(7, this->hasbias(), output);
  }

  // .CoreML.Specification.WeightParams weights = 8;
  if (this->has_weights()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      8, *this->weights_, output);
  }

  // .CoreML.Specification.WeightParams bias = 9;
  if (this->has_bias()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      9, *this->bias_, output);
  }

  // bool int8DynamicQuantize = 10;
  if (this->int8dynamicquantize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(10, this->int8dynamicquantize(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.BatchedMatMulLayerParams)
}